

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::access_chain_needs_stage_io_builtin_translation
          (CompilerMSL *this,uint32_t base)

{
  bool bVar1;
  ExecutionModel EVar2;
  SPIRVariable *pSVar3;
  bool bVar4;
  
  pSVar3 = Compiler::maybe_get_backing_variable((Compiler *)this,base);
  bVar4 = true;
  if (pSVar3 != (SPIRVariable *)0x0) {
    bVar1 = Compiler::is_tessellation_shader((Compiler *)this);
    if (bVar1) {
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      if (EVar2 == ExecutionModelTessellationEvaluation) {
        bVar4 = pSVar3->storage == StorageClassOutput;
      }
      else {
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool CompilerMSL::access_chain_needs_stage_io_builtin_translation(uint32_t base)
{
	auto *var = maybe_get_backing_variable(base);
	if (!var || !is_tessellation_shader())
		return true;

	// We only need to rewrite builtin access chains when accessing flattened builtins like gl_ClipDistance_N.
	// Avoid overriding it back to just gl_ClipDistance.
	// This can only happen in scenarios where we cannot flatten/unflatten access chains, so, the only case
	// where this triggers is evaluation shader inputs.
	bool redirect_builtin = is_tese_shader() ? var->storage == StorageClassOutput : false;
	return redirect_builtin;
}